

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<char_const*,Json::Value>
          (TestResult *result,char *expected,Value *actual,char *file,uint line,char *expr)

{
  bool bVar1;
  TestResult *in_RDX;
  TestResult *in_RDI;
  Value *in_stack_000000e8;
  TestResult *in_stack_000000f0;
  Value *in_stack_ffffffffffffff38;
  Value *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Value *in_stack_ffffffffffffff50;
  char *file_00;
  Value *in_stack_ffffffffffffff70;
  char local_58 [80];
  TestResult *local_8;
  
  file_00 = local_58;
  local_8 = in_RDI;
  Json::Value::Value(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  bVar1 = Json::Value::operator!=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Json::Value::~Value(in_stack_ffffffffffffff70);
  if (bVar1) {
    TestResult::addFailure
              (in_RDX,file_00,(uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),
               in_stack_ffffffffffffff48);
    TestResult::operator<<(in_stack_000000f0,(char (*) [11])in_stack_000000e8);
    Json::Value::Value(in_stack_ffffffffffffff50,&stack0xffffffffffffff70);
    TestResult::operator<<(in_stack_000000f0,in_stack_000000e8);
    TestResult::operator<<(in_stack_000000f0,(char (*) [2])in_stack_000000e8);
    Json::Value::~Value(in_stack_ffffffffffffff70);
    TestResult::operator<<(in_stack_000000f0,(char (*) [11])in_stack_000000e8);
    TestResult::operator<<(in_stack_000000f0,in_stack_000000e8);
  }
  return local_8;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}